

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler.c
# Opt level: O2

int strlen_color(char *argument)

{
  byte bVar1;
  short sVar2;
  char cVar3;
  uint uVar4;
  
  if ((argument == (char *)0x0) || (cVar3 = *argument, cVar3 == '\0')) {
    return 0;
  }
  sVar2 = 0;
  do {
    if (cVar3 == '{') {
      bVar1 = argument[1];
      uVar4 = bVar1 - 0x2d;
      if (uVar4 < 0x3a) {
        if ((0x2200000022087f8U >> ((ulong)uVar4 & 0x3f) & 1) == 0) {
          if ((ulong)uVar4 != 0) goto LAB_002f7075;
LAB_002f707f:
          sVar2 = sVar2 + 1;
        }
      }
      else {
LAB_002f7075:
        if (bVar1 != 0x6e) {
          if (bVar1 == 0x78) goto LAB_002f707f;
          sVar2 = sVar2 + 2;
        }
      }
      argument = argument + 2;
    }
    else {
      if (cVar3 == '\0') {
        return (int)sVar2;
      }
      argument = argument + 1;
      sVar2 = sVar2 + 1;
    }
    cVar3 = *argument;
  } while( true );
}

Assistant:

int strlen_color(char *argument)
{
	char *str;
	short length;

	if (argument == nullptr || argument[0] == '\0')
		return 0;

	length = 0;
	str = argument;

	while (*str != '\0')
	{
		if (*str != '{')
		{
			str++;
			length++;
			continue;
		}

		switch (*(++str))
		{
			case '-':
			case 'x':
				length++;
				break;
			case '<':
			case '0':
			case '1':
			case '2':
			case '3':
			case '4':
			case '5':
			case '6':
			case '7':
			case 'B':
			case 'b':
			case 'F':
			case 'f':
			case 'n':
				break;
			default:
				length += 2;
				break;
		}

		str++;
	}

	return length;
}